

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-internal-utils.cc
# Opt level: O3

bool testing::internal::Base64Unescape(string *encoded,string *decoded)

{
  size_type sVar1;
  pointer pcVar2;
  int iVar3;
  uint uVar4;
  size_type sVar5;
  int iVar6;
  
  decoded->_M_string_length = 0;
  *(decoded->_M_dataplus)._M_p = '\0';
  std::__cxx11::string::reserve((ulong)decoded);
  sVar1 = encoded->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (encoded->_M_dataplus)._M_p;
    sVar5 = 0;
    uVar4 = 0;
    do {
      iVar6 = (int)pcVar2[sVar5];
      iVar3 = isspace(iVar6);
      if ((iVar6 != 0x3d) && (iVar3 == 0)) {
        if ('?' < "AAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAA>A>A?456789:;<=AAAAAAA"[iVar6]) {
          decoded->_M_string_length = 0;
          *(decoded->_M_dataplus)._M_p = '\0';
          return false;
        }
        if (uVar4 == 0) {
          uVar4 = 6;
        }
        else {
          std::__cxx11::string::push_back((char)decoded);
          uVar4 = uVar4 + 6 & 7;
        }
      }
      sVar5 = sVar5 + 1;
    } while (sVar1 != sVar5);
  }
  return true;
}

Assistant:

bool Base64Unescape(const std::string& encoded, std::string* decoded) {
  decoded->clear();
  size_t encoded_len = encoded.size();
  decoded->reserve(3 * (encoded_len / 4) + (encoded_len % 4));
  int bit_pos = 0;
  char dst = 0;
  for (int src : encoded) {
    if (std::isspace(src) || src == '=') {
      continue;
    }
    char src_bin = kUnBase64[static_cast<size_t>(src)];
    if (src_bin >= 64) {
      decoded->clear();
      return false;
    }
    if (bit_pos == 0) {
      dst |= static_cast<char>(src_bin << 2);
      bit_pos = 6;
    } else {
      dst |= static_cast<char>(src_bin >> (bit_pos - 2));
      decoded->push_back(dst);
      dst = static_cast<char>(src_bin << (10 - bit_pos));
      bit_pos = (bit_pos + 6) % 8;
    }
  }
  return true;
}